

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_number_add_ascii_float_mapping
              (coda_type_number *type,coda_ascii_float_mapping *mapping)

{
  coda_ascii_float_mapping *mapping_local;
  coda_type_number *type_local;
  
  if (type == (coda_type_number *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x724);
    type_local._4_4_ = -1;
  }
  else if (mapping == (coda_ascii_float_mapping *)0x0) {
    coda_set_error(-100,"mapping argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x729);
    type_local._4_4_ = -1;
  }
  else if (type->type_class == coda_real_class) {
    type_local._4_4_ =
         mapping_type_add_mapping((coda_type *)type,&type->mappings,(coda_ascii_mapping *)mapping);
  }
  else {
    coda_set_error(-400,"cannot add floating point ascii mapping to integer type");
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_type_number_add_ascii_float_mapping(coda_type_number *type, coda_ascii_float_mapping *mapping)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (mapping == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "mapping argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->type_class != coda_real_class)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "cannot add floating point ascii mapping to integer type");
        return -1;
    }
    return mapping_type_add_mapping((coda_type *)type, &type->mappings, (coda_ascii_mapping *)mapping);
}